

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

void __thiscall
dynet::NaryTreeLSTMBuilder::NaryTreeLSTMBuilder
          (NaryTreeLSTMBuilder *this,uint N,uint layers,uint input_dim,uint hidden_dim,
          ParameterCollection *model)

{
  ParameterCollection *this_00;
  Parameter PVar1;
  LookupParameter LVar2;
  LookupParameter LVar3;
  Parameter PVar4;
  Parameter PVar5;
  LookupParameter LVar6;
  LookupParameter LVar7;
  Parameter PVar8;
  Parameter PVar9;
  LookupParameter LVar10;
  LookupParameter LVar11;
  Parameter PVar12;
  Parameter PVar13;
  LookupParameter LVar14;
  Parameter PVar15;
  bool bVar16;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<unsigned_int> x_08;
  initializer_list<unsigned_int> x_09;
  initializer_list<unsigned_int> x_10;
  initializer_list<unsigned_int> x_11;
  initializer_list<unsigned_int> x_12;
  initializer_list<unsigned_int> x_13;
  initializer_list<dynet::Parameter> __l;
  initializer_list<dynet::LookupParameter> __l_00;
  uint local_1a8;
  allocator local_1a1;
  vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_> lps;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  uint local_154;
  ParameterCollection local_d0;
  
  (this->super_TreeLSTMBuilder).super_RNNBuilder.cur = -1;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.sm.q_ = CREATED;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder.head.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TreeLSTMBuilder).super_RNNBuilder._vptr_RNNBuilder =
       (_func_int **)&PTR__NaryTreeLSTMBuilder_007105a8;
  this_00 = &this->local_model;
  ParameterCollection::ParameterCollection(this_00);
  memset(&this->params,0,0x90);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->c0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->layers = layers;
  this->N = N;
  this->cg = (ComputationGraph *)0x0;
  std::__cxx11::string::string((string *)&ps,"nary-tree-lstm-builder",(allocator *)&lps);
  ParameterCollection::add_subcollection(&local_d0,model,(string *)&ps);
  ParameterCollection::operator=(this_00,&local_d0);
  ParameterCollection::~ParameterCollection(&local_d0);
  std::__cxx11::string::~string((string *)&ps);
  local_154 = layers;
  while( true ) {
    bVar16 = local_154 == 0;
    local_154 = local_154 - 1;
    if (bVar16) break;
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
    x._M_len = 2;
    x._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    PVar1 = ParameterCollection::add_parameters
                      (this_00,(Dim *)&local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_00._M_len = 2;
    x_00._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_00);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar2 = ParameterCollection::add_lookup_parameters
                      (this_00,N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_01._M_len = 2;
    x_01._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_01);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar3 = ParameterCollection::add_lookup_parameters
                      (this_00,N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_02._M_len = 1;
    x_02._M_array = &local_1a8;
    local_1a8 = hidden_dim;
    Dim::Dim((Dim *)&local_d0,x_02);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ParameterInit_0070fae0;
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_1a1);
    PVar4 = ParameterCollection::add_parameters
                      (this_00,(Dim *)&local_d0,(ParameterInit *)&lps,(string *)&ps,
                       dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
    x_03._M_len = 2;
    x_03._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_03);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    PVar5 = ParameterCollection::add_parameters
                      (this_00,(Dim *)&local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_04._M_len = 2;
    x_04._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_04);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar6 = ParameterCollection::add_lookup_parameters
                      (this_00,N * N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_05._M_len = 2;
    x_05._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_05);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar7 = ParameterCollection::add_lookup_parameters
                      (this_00,N * N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_06._M_len = 1;
    x_06._M_array = &local_1a8;
    local_1a8 = hidden_dim;
    Dim::Dim((Dim *)&local_d0,x_06);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ParameterInit_0070fae0;
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_1a1);
    PVar8 = ParameterCollection::add_parameters
                      (this_00,(Dim *)&local_d0,(ParameterInit *)&lps,(string *)&ps,
                       dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
    x_07._M_len = 2;
    x_07._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_07);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    PVar9 = ParameterCollection::add_parameters
                      (this_00,(Dim *)&local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_08._M_len = 2;
    x_08._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_08);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar10 = ParameterCollection::add_lookup_parameters
                       (this_00,N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_09._M_len = 2;
    x_09._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_09);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar11 = ParameterCollection::add_lookup_parameters
                       (this_00,N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_10._M_len = 1;
    x_10._M_array = &local_1a8;
    local_1a8 = hidden_dim;
    Dim::Dim((Dim *)&local_d0,x_10);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ParameterInit_0070fae0;
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_1a1);
    PVar12 = ParameterCollection::add_parameters
                       (this_00,(Dim *)&local_d0,(ParameterInit *)&lps,(string *)&ps,
                        dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(input_dim,hidden_dim);
    x_11._M_len = 2;
    x_11._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_11);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    PVar13 = ParameterCollection::add_parameters
                       (this_00,(Dim *)&local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)CONCAT44(hidden_dim,hidden_dim);
    x_12._M_len = 2;
    x_12._M_array = (iterator)&lps;
    Dim::Dim((Dim *)&local_d0,x_12);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_1a8);
    LVar14 = ParameterCollection::add_lookup_parameters
                       (this_00,N,(Dim *)&local_d0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_13._M_len = 1;
    x_13._M_array = &local_1a8;
    local_1a8 = hidden_dim;
    Dim::Dim((Dim *)&local_d0,x_13);
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ParameterInit_0070fae0;
    lps.super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_1a1);
    PVar15 = ParameterCollection::add_parameters
                       (this_00,(Dim *)&local_d0,(ParameterInit *)&lps,(string *)&ps,
                        dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    __l._M_len = 8;
    __l._M_array = (iterator)&local_d0;
    local_d0.name._M_dataplus._M_p = (pointer)PVar1;
    local_d0.name._M_string_length = (size_type)PVar4;
    local_d0.name.field_2._M_allocated_capacity = (size_type)PVar5;
    local_d0.name.field_2._8_8_ = PVar8;
    local_d0.name_cntr._M_h._M_buckets = (__buckets_ptr)PVar9;
    local_d0.name_cntr._M_h._M_bucket_count = (size_type)PVar12;
    local_d0.name_cntr._M_h._M_before_begin._M_nxt = (_Hash_node_base *)PVar13;
    local_d0.name_cntr._M_h._M_element_count = (size_type)PVar15;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (&ps,__l,(allocator_type *)&lps);
    __l_00._M_len = 7;
    __l_00._M_array = (iterator)&local_d0;
    local_d0.name._M_dataplus._M_p = (pointer)LVar2;
    local_d0.name._M_string_length = (size_type)LVar6;
    local_d0.name.field_2._M_allocated_capacity = (size_type)LVar10;
    local_d0.name.field_2._8_8_ = LVar14;
    local_d0.name_cntr._M_h._M_buckets = (__buckets_ptr)LVar3;
    local_d0.name_cntr._M_h._M_bucket_count = (size_type)LVar7;
    local_d0.name_cntr._M_h._M_before_begin._M_nxt = (_Hash_node_base *)LVar11;
    std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::vector
              (&lps,__l_00,(allocator_type *)&local_1a8);
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back(&this->params,(value_type *)&ps);
    std::
    vector<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>,_std::allocator<std::vector<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>_>_>
    ::push_back(&this->lparams,
                (value_type *)
                &lps.
                 super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
               );
    std::_Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>::
    ~_Vector_base(&lps.
                   super__Vector_base<dynet::LookupParameter,_std::allocator<dynet::LookupParameter>_>
                 );
    std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
              ((_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&ps);
    input_dim = hidden_dim;
  }
  return;
}

Assistant:

NaryTreeLSTMBuilder::NaryTreeLSTMBuilder(unsigned N,
                         unsigned layers,
                         unsigned input_dim,
                         unsigned hidden_dim,
                         ParameterCollection& model) : layers(layers), N(N), cg(nullptr) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("nary-tree-lstm-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // i
    Parameter p_x2i = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2i = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bi = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // f
    Parameter p_x2f = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    LookupParameter p_c2f = local_model.add_lookup_parameters(N*N, {hidden_dim, hidden_dim});
    Parameter p_bf = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // o
    Parameter p_x2o = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    LookupParameter p_c2o = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bo = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // c (a.k.a. u)
    Parameter p_x2c = local_model.add_parameters({hidden_dim, layer_input_dim});
    LookupParameter p_h2c = local_model.add_lookup_parameters(N, {hidden_dim, hidden_dim});
    Parameter p_bc = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2i, p_bi, p_x2f, p_bf, p_x2o, p_bo, p_x2c, p_bc};
    vector<LookupParameter> lps = {p_h2i, p_h2f, p_h2o, p_h2c, p_c2i, p_c2f, p_c2o};
    params.push_back(ps);
    lparams.push_back(lps);
  }  // layers
}